

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O2

void __thiscall
RemoveVCProcessTest_testMeshRemove_Test::TestBody(RemoveVCProcessTest_testMeshRemove_Test *this)

{
  RemoveVCProcess *pRVar1;
  char *message;
  char *in_R9;
  bool bVar2;
  AssertHelper AStack_58;
  AssertHelper local_50;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  
  ((this->super_RemoveVCProcessTest).piProcess)->configDeleteFlags = 0x400;
  pRVar1 = (this->super_RemoveVCProcessTest).piProcess;
  (*(pRVar1->super_BaseProcess)._vptr_BaseProcess[5])
            (pRVar1,(this->super_RemoveVCProcessTest).pScene);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = ((this->super_RemoveVCProcessTest).pScene)->mMeshes == (aiMesh **)0x0;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&AStack_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"NULL == pScene->mMeshes","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x7e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&AStack_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"0U","pScene->mNumMeshes",(uint *)&gtest_ar_,
             &((this->super_RemoveVCProcessTest).pScene)->mNumMeshes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = ((this->super_RemoveVCProcessTest).pScene)->mFlags == 1;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&AStack_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"pScene->mFlags == AI_SCENE_FLAGS_INCOMPLETE","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x80,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&AStack_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(RemoveVCProcessTest, testMeshRemove)
{
    piProcess->SetDeleteFlags(aiComponent_MESHES);
    piProcess->Execute(pScene);

    EXPECT_TRUE(NULL == pScene->mMeshes);
    EXPECT_EQ(0U, pScene->mNumMeshes);
    EXPECT_TRUE(pScene->mFlags == AI_SCENE_FLAGS_INCOMPLETE);
}